

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlParserShrink(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserInputBufferPtr pxVar1;
  size_t sVar2;
  unsigned_long uVar3;
  size_t pos;
  
  input = ctxt->input;
  pxVar1 = input->buf;
  if ((pxVar1 != (xmlParserInputBufferPtr)0x0) &&
     (pos = (long)input->cur - (long)input->base, 0x50 < pos)) {
    sVar2 = xmlBufShrink(pxVar1->buffer,pos - 0x50);
    if (sVar2 != 0) {
      pos = pos - sVar2;
      uVar3 = 0xffffffffffffffff;
      if (!CARRY8(input->consumed,sVar2)) {
        uVar3 = input->consumed + sVar2;
      }
      input->consumed = uVar3;
    }
    xmlBufUpdateInput(pxVar1->buffer,input,pos);
    return;
  }
  return;
}

Assistant:

void
xmlParserShrink(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf = in->buf;
    size_t used, res;

    if (buf == NULL)
        return;

    used = in->cur - in->base;

    if (used > LINE_LEN) {
        res = xmlBufShrink(buf->buffer, used - LINE_LEN);

        if (res > 0) {
            used -= res;
            if ((res > ULONG_MAX) ||
                (in->consumed > ULONG_MAX - (unsigned long)res))
                in->consumed = ULONG_MAX;
            else
                in->consumed += res;
        }

        xmlBufUpdateInput(buf->buffer, in, used);
    }
}